

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O1

void __thiscall
TPZFrontNonSym<std::complex<double>_>::AddKel
          (TPZFrontNonSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  complex<double> *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  complex<double> *pcVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar2 = sourceindex->fNElements;
  if (0 < lVar2) {
    lVar11 = 0;
    do {
      iVar8 = Local(this,destinationindex->fStore[lVar11]);
      lVar12 = 0;
      do {
        iVar9 = Local(this,destinationindex->fStore[lVar12]);
        lVar3 = sourceindex->fStore[lVar11];
        lVar4 = sourceindex->fStore[lVar12];
        if ((((lVar3 < 0) ||
             ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar3)) ||
            (lVar4 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar4)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar10 = (long)(this->super_TPZFront<std::complex<double>_>).fMaxFront * (long)iVar9;
        pcVar5 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
        dVar6 = *(double *)
                 (elmat->fElem
                  [lVar4 * (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow
                   + lVar3]._M_value + 8);
        pcVar1 = pcVar5 + lVar10 + iVar8;
        dVar7 = *(double *)(pcVar1->_M_value + 8);
        pcVar5 = pcVar5 + lVar10 + iVar8;
        *(double *)pcVar5->_M_value =
             *(double *)pcVar1->_M_value +
             *(double *)
              elmat->fElem
              [lVar4 * (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow +
               lVar3]._M_value;
        *(double *)(pcVar5->_M_value + 8) = dVar7 + dVar6;
        lVar12 = lVar12 + 1;
      } while (lVar2 != lVar12);
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar2);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = 0; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}